

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_limit_aspect_ratio_field(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *aspect_ratio_field)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  REF_NODE pRVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 local_98 [16];
  double local_88;
  
  pRVar4 = ref_grid->node;
  if (ref_grid->twod == 0) {
    if (0 < pRVar4->max) {
      lVar7 = 0;
      do {
        if (-1 < pRVar4->global[lVar7]) {
          dVar14 = aspect_ratio_field[lVar7];
          uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
          if (uVar3 != 0) {
            pcVar6 = "eigen decomp";
            uVar5 = 0x825;
            goto LAB_001a8022;
          }
          dVar8 = local_98._8_8_;
          if (local_98._8_8_ <= local_98._0_8_) {
            dVar8 = local_98._0_8_;
          }
          dVar2 = local_88;
          if (local_88 <= dVar8) {
            dVar2 = dVar8;
          }
          dVar14 = dVar14 * dVar14;
          auVar13._0_8_ = dVar14 * 1e+20;
          auVar13._8_8_ = dVar2;
          auVar10._8_8_ = -dVar2;
          auVar10._0_8_ = -auVar13._0_8_;
          auVar10 = maxpd(auVar13,auVar10);
          if (auVar10._8_8_ < auVar10._0_8_) {
            auVar11._0_8_ = dVar2 / dVar14;
            if (local_88 <= auVar11._0_8_) {
              local_88 = auVar11._0_8_;
            }
            auVar11._8_8_ = auVar11._0_8_;
            local_98 = maxpd(local_98,auVar11);
            uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
            if (uVar3 != 0) {
              pcVar6 = "reform m";
              uVar5 = 0x831;
              goto LAB_001a8022;
            }
          }
        }
        lVar7 = lVar7 + 1;
        pRVar4 = ref_grid->node;
        metric = metric + 6;
      } while (lVar7 < pRVar4->max);
    }
  }
  else if (0 < pRVar4->max) {
    lVar7 = 0;
    do {
      if (-1 < pRVar4->global[lVar7]) {
        dVar14 = aspect_ratio_field[lVar7];
        uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar6 = "eigen decomp";
          uVar5 = 0x813;
LAB_001a8022:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar5,"ref_metric_limit_aspect_ratio_field",(ulong)uVar3,pcVar6);
          return uVar3;
        }
        uVar3 = ref_matrix_descending_eig_twod((REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar6 = "2D eig sort";
          uVar5 = 0x814;
          goto LAB_001a8022;
        }
        dVar8 = local_98._8_8_;
        if (local_98._8_8_ <= local_98._0_8_) {
          dVar8 = local_98._0_8_;
        }
        dVar14 = dVar14 * dVar14;
        auVar9._0_8_ = dVar14 * 1e+20;
        auVar9._8_8_ = dVar8;
        auVar12._0_8_ = -auVar9._0_8_;
        auVar12._8_8_ = -dVar8;
        auVar10 = maxpd(auVar9,auVar12);
        if (auVar10._8_8_ < auVar10._0_8_) {
          dVar8 = dVar8 / dVar14;
          auVar1._8_8_ = dVar8;
          auVar1._0_8_ = dVar8;
          local_98 = maxpd(local_98,auVar1);
          uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
          if (uVar3 != 0) {
            pcVar6 = "reform m";
            uVar5 = 0x81d;
            goto LAB_001a8022;
          }
          uVar3 = ref_matrix_twod_m(metric);
          if (uVar3 != 0) {
            pcVar6 = "enforce 2D m for roundoff";
            uVar5 = 0x81f;
            goto LAB_001a8022;
          }
        }
      }
      lVar7 = lVar7 + 1;
      pRVar4 = ref_grid->node;
      metric = metric + 6;
    } while (lVar7 < pRVar4->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_aspect_ratio_field(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *aspect_ratio_field) {
  REF_DBL diag_system[12];
  REF_DBL max_eig, limit_eig;
  REF_INT node;
  REF_DBL aspect_ratio;
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(diag_system), "2D eig sort");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
        RSS(ref_matrix_twod_m(&(metric[6 * node])),
            "enforce 2D m for roundoff");
      }
    }
  } else {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      max_eig = MAX(ref_matrix_eig(diag_system, 2), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        ref_matrix_eig(diag_system, 2) =
            MAX(ref_matrix_eig(diag_system, 2), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
      }
    }
  }
  return REF_SUCCESS;
}